

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O2

bool __thiscall
diy::
concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::empty(concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        *this)

{
  size_t sVar1;
  lock_guard<fast_mutex> l;
  unique_lock<tthread::fast_mutex> local_20;
  
  std::unique_lock<tthread::fast_mutex>::unique_lock(&local_20,&this->mutex_);
  sVar1 = (this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_20);
  return sVar1 == 0;
}

Assistant:

bool            empty()                 { lock_guard<fast_mutex> l(mutex_); return map_.empty(); }